

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O0

int PAL_wmemcmp(char16_t *string1,char16_t *string2,size_t count)

{
  bool bVar1;
  size_t *num2;
  size_t *num1;
  size_t blockSize;
  long lStack_38;
  int diff;
  size_t wi;
  size_t i;
  size_t count_local;
  char16_t *string2_local;
  char16_t *string1_local;
  
  lStack_38 = 0;
  blockSize._4_4_ = 0;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (string1 == string2) {
    string1_local._4_4_ = 0;
  }
  else {
    while( true ) {
      bVar1 = false;
      if ((ulong)((lStack_38 + 1) * 4) < count) {
        bVar1 = *(long *)(string1 + lStack_38 * 4) == *(long *)(string2 + lStack_38 * 4);
      }
      if (!bVar1) break;
      lStack_38 = lStack_38 + 1;
    }
    wi = lStack_38 << 2;
    while ((wi < count &&
           (blockSize._4_4_ = (uint)(ushort)string1[wi] - (uint)(ushort)string2[wi],
           blockSize._4_4_ == 0))) {
      wi = wi + 1;
    }
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    string1_local._4_4_ = blockSize._4_4_;
  }
  return string1_local._4_4_;
}

Assistant:

int
__cdecl
PAL_wmemcmp(
        const char16_t *string1,
        const char16_t *string2,
        size_t count)
{
    size_t i, wi = 0;
    int diff = 0;

    PERF_ENTRY(wmemcmp);
    ENTRY("wmemcmp (string1=%p (%S), string2=%p (%S) count=%lu)\n",
          string1?string1:W16_NULLSTRING,
          string1?string1:W16_NULLSTRING, string2?string2:W16_NULLSTRING, string2?string2:W16_NULLSTRING,
          (unsigned long) count);

    if (string1 == string2) return diff;

    constexpr size_t blockSize = sizeof(size_t) / sizeof(char16_t);
    const     size_t *num1     = (const size_t*)(string1);
    const     size_t *num2     = (const size_t*)(string2);

    while( (count > blockSize * (wi + 1)) && num1[wi] == num2[wi] ) ++wi;

    for (i = blockSize * wi; i < count; ++i)
    {
        diff = string1[i] - string2[i];
        if (diff != 0)
        {
            break;
        }
    }

    LOGEXIT("wmemcmp returning int %d\n", diff);
    PERF_EXIT(wmemcmp);
    return diff;
}